

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void test<int>(int expected,string *value)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  AssertionResult *this_00;
  char *pcVar1;
  char *in_R9;
  undefined1 local_60 [11];
  bool valid;
  int expected_local;
  int result2;
  AssertionResult gtest_ar_;
  int result;
  AssertionResult gtest_ar;
  
  pcVar1 = (value->_M_dataplus)._M_p;
  expected_local = expected;
  result = jsteemann::atoi<int>(pcVar1,pcVar1 + value->_M_string_length,&valid);
  this = &gtest_ar_.message_;
  gtest_ar_.success_ = valid;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (valid == false) {
    testing::Message::Message((Message *)local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x143744,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&result2,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    this_00 = (AssertionResult *)local_60;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected","result",&expected_local,&result);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pcVar1 = (value->_M_dataplus)._M_p;
      result2 = jsteemann::atoi_unchecked<int>(pcVar1,pcVar1 + value->_M_string_length);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"expected","result2",&expected_local,&result2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      this = &gtest_ar.message_;
      goto LAB_0012672b;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x19,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&gtest_ar_);
    this = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    this_00 = &gtest_ar_;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0012672b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this);
  return;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}